

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_ABCfunctions.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_ABCfunctions::ChFunctionRotation_ABCfunctions
          (ChFunctionRotation_ABCfunctions *this)

{
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_ABCfunctions_01192ba0;
  (this->angleA).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->angleA).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->angleB).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->angleB).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->angleB).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->angleB).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->angleC).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->angleC).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->angleA,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->angleB,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->angleC,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  this->angleset = RXYZ;
  return;
}

Assistant:

ChFunctionRotation_ABCfunctions::ChFunctionRotation_ABCfunctions() {

	// default s(t) function. User will provide better fx.
    this->angleA = chrono_types::make_shared<ChFunction_Const>(0);
	this->angleB = chrono_types::make_shared<ChFunction_Const>(0);
	this->angleC = chrono_types::make_shared<ChFunction_Const>(0);
	this->angleset = AngleSet::RXYZ;
}